

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O3

int share_forwarding_cmp(void *av,void *bv)

{
  uint uVar1;
  
  uVar1 = strcmp(*av,*bv);
  if (uVar1 == 0) {
    uVar1 = 0xffffffff;
    if (*(int *)((long)bv + 8) <= *(int *)((long)av + 8)) {
      uVar1 = (uint)(*(int *)((long)bv + 8) < *(int *)((long)av + 8));
    }
  }
  return uVar1;
}

Assistant:

static int share_forwarding_cmp(void *av, void *bv)
{
    const struct share_forwarding *a = (const struct share_forwarding *)av;
    const struct share_forwarding *b = (const struct share_forwarding *)bv;
    int i;

    if ((i = strcmp(a->host, b->host)) != 0)
        return i;
    else if (a->port < b->port)
        return -1;
    else if (a->port > b->port)
        return +1;
    else
        return 0;
}